

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialer.c
# Opt level: O1

void nni_dialer_bump_error(nni_dialer *d,int err)

{
  long lVar1;
  
  switch(err) {
  case 2:
    lVar1 = 0x850;
    break;
  case 5:
    lVar1 = 0x790;
    break;
  case 6:
    lVar1 = 0x690;
    break;
  case 7:
    return;
  case 0xd:
    lVar1 = 2000;
    break;
  case 0x12:
  case 0x13:
    lVar1 = 0x6d0;
    break;
  case 0x14:
    lVar1 = 0x710;
    break;
  default:
    if (err - 0x1aU < 2) {
      lVar1 = 0x810;
      break;
    }
  case 3:
  case 4:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
    lVar1 = 0x750;
  }
  nni_stat_inc((nni_stat_item *)((long)&(d->d_ops).d_size + lVar1),1);
  return;
}

Assistant:

void
nni_dialer_bump_error(nni_dialer *d, int err)
{
#ifdef NNG_ENABLE_STATS
	switch (err) {
	case NNG_ECONNABORTED:
	case NNG_ECONNRESET:
		nni_stat_inc(&d->st_disconnect, 1);
		break;
	case NNG_ECONNREFUSED:
		nni_stat_inc(&d->st_refused, 1);
		break;
	case NNG_ECANCELED:
		nni_stat_inc(&d->st_canceled, 1);
		break;
	case NNG_ETIMEDOUT:
		nni_stat_inc(&d->st_timeout, 1);
		break;
	case NNG_EPROTO:
		nni_stat_inc(&d->st_proto, 1);
		break;
	case NNG_EPEERAUTH:
	case NNG_ECRYPTO:
		nni_stat_inc(&d->st_auth, 1);
		break;
	case NNG_ENOMEM:
		nni_stat_inc(&d->st_oom, 1);
		break;
	case NNG_ECLOSED:
		// do nothing.
		break;
	default:
		nni_stat_inc(&d->st_other, 1);
		break;
	}
#else
	NNI_ARG_UNUSED(d);
	NNI_ARG_UNUSED(err);
#endif
}